

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Deferred<kj::Function<void_()>_> * __thiscall
kj::defer<kj::Function<void()>>
          (Deferred<kj::Function<void_()>_> *__return_storage_ptr__,kj *this,Function<void_()> *func
          )

{
  Function<void_()> *func_00;
  Function<void_()> *func_local;
  
  func_00 = fwd<kj::Function<void()>>((NoInfer<kj::Function<void_()>_> *)this);
  _::Deferred<kj::Function<void_()>_>::Deferred(__return_storage_ptr__,func_00);
  return __return_storage_ptr__;
}

Assistant:

_::Deferred<Func> defer(Func&& func) {
  // Returns an object which will invoke the given functor in its destructor. The object is not
  // copyable but is move-constructable with the semantics you'd expect. Since the return type is
  // private, you need to assign to an `auto` variable.
  //
  // The KJ_DEFER macro provides slightly more convenient syntax for the common case where you
  // want some code to run at current scope exit.
  //
  // KJ_DEFER does not support move-assignment for its returned objects. If you need to reuse the
  // variable for your deferred function object, then you will want to write your own class for that
  // purpose.

  return _::Deferred<Func>(kj::fwd<Func>(func));
}